

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

int __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::ClassId(TPZGeoBlend<pzgeom::TPZGeoQuad> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TPZGeoBlend",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZGeoQuad::ClassId(&this->super_TPZGeoQuad);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoBlend<TGeo>::ClassId() const {
        return Hash("TPZGeoBlend") ^ TGeo::ClassId() << 1;
    }